

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

int stb__hashfind(void *p)

{
  uint uVar1;
  uint local_24;
  int n;
  int s;
  stb_uint32 h;
  void *p_local;
  
  uVar1 = stb_hashptr(p);
  local_24 = uVar1 & stb__alloc_mask;
  p_local._4_4_ = local_24;
  if (stb__allocations[(int)local_24].p != p) {
    do {
      if (stb__allocations[(int)local_24].p == (void *)0x0) {
        return -1;
      }
      local_24 = local_24 + (uVar1 + (uVar1 >> 6) + (uVar1 >> 0x13) | 1) & stb__alloc_mask;
      p_local._4_4_ = local_24;
    } while (stb__allocations[(int)local_24].p != p);
  }
  return p_local._4_4_;
}

Assistant:

static int stb__hashfind(void *p)
{
   stb_uint32 h = stb_hashptr(p);
   int s,n = h & stb__alloc_mask;
   if (stb__allocations[n].p == p)
      return n;
   s = stb_rehash(h)|1;
   for(;;) {
      if (stb__allocations[n].p == NULL)
         return -1;
      n = (n+s) & stb__alloc_mask;
      if (stb__allocations[n].p == p)
         return n;
   }
}